

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZEqnArray<float>,_10>::~TPZManVector(TPZManVector<TPZEqnArray<float>,_10> *this)

{
  TPZEqnArray<float> *pTVar1;
  long lVar2;
  long lVar3;
  
  (this->super_TPZVec<TPZEqnArray<float>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019b5b20
  ;
  if ((this->super_TPZVec<TPZEqnArray<float>_>).fStore == (TPZEqnArray<float> *)&this->field_0x20) {
    (this->super_TPZVec<TPZEqnArray<float>_>).fStore = (TPZEqnArray<float> *)0x0;
  }
  (this->super_TPZVec<TPZEqnArray<float>_>).fNAlloc = 0;
  lVar3 = 0x13a90;
  do {
    TPZEqnArray<float>::~TPZEqnArray
              ((TPZEqnArray<float> *)
               ((long)&(this->super_TPZVec<TPZEqnArray<float>_>)._vptr_TPZVec + lVar3));
    lVar3 = lVar3 + -0x22f0;
  } while (lVar3 != -0x22d0);
  (this->super_TPZVec<TPZEqnArray<float>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019b5b60;
  pTVar1 = (this->super_TPZVec<TPZEqnArray<float>_>).fStore;
  if (pTVar1 != (TPZEqnArray<float> *)0x0) {
    lVar3 = *(long *)&pTVar1[-1].fLastTerm;
    if (lVar3 != 0) {
      lVar2 = lVar3 * 0x22f0;
      do {
        TPZEqnArray<float>::~TPZEqnArray
                  ((TPZEqnArray<float> *)
                   ((long)pTVar1[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc + lVar2 + -0x28
                   ));
        lVar2 = lVar2 + -0x22f0;
      } while (lVar2 != 0);
    }
    operator_delete__(&pTVar1[-1].fLastTerm,lVar3 * 0x22f0 | 8);
    return;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}